

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::(anonymous_namespace)::VarintErrorCasesWithSizes_ReadVarint64Error_Test::
~VarintErrorCasesWithSizes_ReadVarint64Error_Test
          (VarintErrorCasesWithSizes_ReadVarint64Error_Test *this)

{
  io::anon_unknown_0::VarintErrorCasesWithSizes_ReadVarint64Error_Test::
  ~VarintErrorCasesWithSizes_ReadVarint64Error_Test
            ((VarintErrorCasesWithSizes_ReadVarint64Error_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(VarintErrorCasesWithSizes, ReadVarint64Error) {
  VarintErrorCase kVarintErrorCases_case = std::get<0>(GetParam());
  int kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kVarintErrorCases_case.bytes, kVarintErrorCases_case.size);
  ArrayInputStream input(buffer_, static_cast<int>(kVarintErrorCases_case.size),
                         kBlockSizes_case);
  CodedInputStream coded_input(&input);

  uint64_t value;
  EXPECT_EQ(kVarintErrorCases_case.can_parse, coded_input.ReadVarint64(&value));
}